

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstream.cpp
# Opt level: O2

void __thiscall sai::ifstream::ifstream(ifstream *this,path *Path)

{
  ifstreambuf *this_00;
  int __oflag;
  
  std::ios::ios((ios *)&(this->super_istream).field_0x10);
  this_00 = (ifstreambuf *)operator_new(0x1278);
  ifstreambuf::ifstreambuf(this_00,(span<const_unsigned_int,_256UL>)0x10aeb4);
  std::istream::istream(this,(streambuf *)&PTR_construction_vtable_24__0010fc98);
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x10fc58;
  *(undefined8 *)&(this->super_istream).field_0x10 = 0x10fc80;
  ifstreambuf::open(*(ifstreambuf **)&(this->super_istream).field_0xf8,(char *)Path,__oflag);
  return;
}

Assistant:

ifstream::ifstream(const std::filesystem::path& Path) : std::istream(new ifstreambuf())
{
	reinterpret_cast<ifstreambuf*>(rdbuf())->open(Path);
}